

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executionengine.cpp
# Opt level: O3

void __thiscall ExecutionEngine::i_ddiv(ExecutionEngine *this)

{
  VMStack *this_00;
  Frame *this_01;
  ulong uVar1;
  ostream *poVar2;
  anon_union_8_10_52016fac_for_data aVar3;
  Value VVar4;
  Value VVar5;
  
  this_00 = VMStack::getInstance();
  this_01 = VMStack::getTopFrame(this_00);
  VVar4 = Frame::popTopOfOperandStack(this_01);
  aVar3 = VVar4.data;
  Frame::popTopOfOperandStack(this_01);
  VVar5 = Frame::popTopOfOperandStack(this_01);
  uVar1 = VVar5._0_8_;
  if (VVar4.type != DOUBLE) {
    __assert_fail("value_2.type == ValueType::DOUBLE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                  ,0x8ac,"void ExecutionEngine::i_ddiv()");
  }
  if ((uVar1 & 0xffffffff00000000) == 0x700000000) {
    if ((aVar3.doubleValue == 0.0) && (!NAN(aVar3.doubleValue))) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"ArithmeticException");
      std::endl<char,std::char_traits<char>>(poVar2);
      exit(2);
    }
    VVar4.data.doubleValue = VVar5.data.doubleValue / aVar3.doubleValue;
    VVar4.printType = (int)uVar1;
    VVar4.type = (int)(uVar1 >> 0x20);
    Frame::pushIntoOperandStack(this_01,VVar4);
    this_01->pc = this_01->pc + 1;
    return;
  }
  __assert_fail("value_1.type == ValueType::DOUBLE",
                "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                ,0x8ad,"void ExecutionEngine::i_ddiv()");
}

Assistant:

void ExecutionEngine::i_ddiv() {
	VMStack &stackFrame = VMStack::getInstance();
	Frame *topFrame = stackFrame.getTopFrame();

	Value value_2 = topFrame->popTopOfOperandStack();
	topFrame->popTopOfOperandStack();
	Value value_1 = topFrame->popTopOfOperandStack();

	assert(value_2.type == ValueType::DOUBLE);
	assert(value_1.type == ValueType::DOUBLE);
	if (value_2.data.doubleValue == 0) {
		cerr << "ArithmeticException" << endl;
		exit(2);
	}
	value_1.data.doubleValue = value_1.data.doubleValue / (value_2.data.doubleValue);
	topFrame->pushIntoOperandStack(value_1);

	topFrame->pc += 1;
}